

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNsPtr xmlCopyNamespace(xmlNsPtr cur)

{
  xmlNsPtr pxVar1;
  
  if ((cur != (xmlNsPtr)0x0) && (cur->type == XML_NAMESPACE_DECL)) {
    pxVar1 = xmlNewNs((xmlNodePtr)0x0,cur->href,cur->prefix);
    return pxVar1;
  }
  return (xmlNsPtr)0x0;
}

Assistant:

xmlNsPtr
xmlCopyNamespace(xmlNsPtr cur) {
    xmlNsPtr ret;

    if (cur == NULL) return(NULL);
    switch (cur->type) {
	case XML_LOCAL_NAMESPACE:
	    ret = xmlNewNs(NULL, cur->href, cur->prefix);
	    break;
	default:
#ifdef DEBUG_TREE
	    xmlGenericError(xmlGenericErrorContext,
		    "xmlCopyNamespace: invalid type %d\n", cur->type);
#endif
	    return(NULL);
    }
    return(ret);
}